

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O0

bool lunasvg::matchPseudoClassSelector(PseudoClassSelector *selector,SVGElement *element)

{
  bool bVar1;
  ElementID EVar2;
  ElementID EVar3;
  SVGNodeList *this;
  reference pvVar4;
  reference pSVar5;
  SVGElement *pSVar6;
  SVGElement *local_b0;
  SVGElement *sibling_1;
  SVGElement *sibling;
  SimpleSelector *simpleSelector_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_> *__range3_1;
  vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_> *subSelector_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  SelectorList *__range2_1;
  SimpleSelector *simpleSelector;
  const_iterator __end3;
  const_iterator __begin3;
  vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_> *__range3;
  vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_> *subSelector;
  const_iterator __end2;
  const_iterator __begin2;
  SelectorList *__range2;
  SVGElement *element_local;
  PseudoClassSelector *selector_local;
  
  if (selector->type == Empty) {
    this = SVGElement::children_abi_cxx11_(element);
    selector_local._7_1_ =
         std::__cxx11::
         list<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
         ::empty(this);
  }
  else if (selector->type == Root) {
    selector_local._7_1_ = SVGNode::isRootElement(&element->super_SVGNode);
  }
  else if (selector->type == Is) {
    __end2 = std::
             vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
             ::begin(&selector->subSelectors);
    subSelector = (vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_> *)
                  std::
                  vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                  ::end(&selector->subSelectors);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_*,_std::vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>_>
                                       *)&subSelector), bVar1) {
      pvVar4 = __gnu_cxx::
               __normal_iterator<const_std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_*,_std::vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>_>
               ::operator*(&__end2);
      __end3 = std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>::begin
                         (pvVar4);
      simpleSelector =
           (SimpleSelector *)
           std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>::end
                     (pvVar4);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_lunasvg::SimpleSelector_*,_std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>
                                         *)&simpleSelector), bVar1) {
        pSVar5 = __gnu_cxx::
                 __normal_iterator<const_lunasvg::SimpleSelector_*,_std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>
                 ::operator*(&__end3);
        bVar1 = matchSimpleSelector(pSVar5,element);
        if (!bVar1) {
          return false;
        }
        __gnu_cxx::
        __normal_iterator<const_lunasvg::SimpleSelector_*,_std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>
        ::operator++(&__end3);
      }
      __gnu_cxx::
      __normal_iterator<const_std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_*,_std::vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>_>
      ::operator++(&__end2);
    }
    selector_local._7_1_ = true;
  }
  else if (selector->type == Not) {
    __end2_1 = std::
               vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
               ::begin(&selector->subSelectors);
    subSelector_1 =
         (vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_> *)
         std::
         vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
         ::end(&selector->subSelectors);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_*,_std::vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>_>
                               *)&subSelector_1), bVar1) {
      pvVar4 = __gnu_cxx::
               __normal_iterator<const_std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_*,_std::vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>_>
               ::operator*(&__end2_1);
      __end3_1 = std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>::
                 begin(pvVar4);
      simpleSelector_1 =
           (SimpleSelector *)
           std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>::end
                     (pvVar4);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<const_lunasvg::SimpleSelector_*,_std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>
                                 *)&simpleSelector_1), bVar1) {
        pSVar5 = __gnu_cxx::
                 __normal_iterator<const_lunasvg::SimpleSelector_*,_std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>
                 ::operator*(&__end3_1);
        bVar1 = matchSimpleSelector(pSVar5,element);
        if (bVar1) {
          return false;
        }
        __gnu_cxx::
        __normal_iterator<const_lunasvg::SimpleSelector_*,_std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>
        ::operator++(&__end3_1);
      }
      __gnu_cxx::
      __normal_iterator<const_std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_*,_std::vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>_>
      ::operator++(&__end2_1);
    }
    selector_local._7_1_ = true;
  }
  else if (selector->type == FirstChild) {
    pSVar6 = SVGElement::previousElement(element);
    selector_local._7_1_ = pSVar6 == (SVGElement *)0x0;
  }
  else if (selector->type == LastChild) {
    pSVar6 = SVGElement::nextElement(element);
    selector_local._7_1_ = pSVar6 == (SVGElement *)0x0;
  }
  else if (selector->type == OnlyChild) {
    pSVar6 = SVGElement::previousElement(element);
    bVar1 = true;
    if (pSVar6 == (SVGElement *)0x0) {
      pSVar6 = SVGElement::nextElement(element);
      bVar1 = pSVar6 != (SVGElement *)0x0;
    }
    selector_local._7_1_ = (bool)(bVar1 ^ 1);
  }
  else if (selector->type == FirstOfType) {
    sibling_1 = SVGElement::previousElement(element);
    while (sibling_1 != (SVGElement *)0x0) {
      EVar2 = SVGElement::id(sibling_1);
      EVar3 = SVGElement::id(element);
      if (EVar2 == EVar3) {
        return false;
      }
      sibling_1 = SVGElement::previousElement(element);
    }
    selector_local._7_1_ = true;
  }
  else if (selector->type == LastOfType) {
    local_b0 = SVGElement::nextElement(element);
    while (local_b0 != (SVGElement *)0x0) {
      EVar2 = SVGElement::id(local_b0);
      EVar3 = SVGElement::id(element);
      if (EVar2 == EVar3) {
        return false;
      }
      local_b0 = SVGElement::nextElement(element);
    }
    selector_local._7_1_ = true;
  }
  else {
    selector_local._7_1_ = false;
  }
  return selector_local._7_1_;
}

Assistant:

static bool matchPseudoClassSelector(const PseudoClassSelector& selector, const SVGElement* element)
{
    if(selector.type == PseudoClassSelector::Type::Empty)
        return element->children().empty();
    if(selector.type == PseudoClassSelector::Type::Root)
        return element->isRootElement();
    if(selector.type == PseudoClassSelector::Type::Is) {
        for(const auto& subSelector : selector.subSelectors) {
            for(const auto& simpleSelector : subSelector) {
                if(!matchSimpleSelector(simpleSelector, element)) {
                    return false;
                }
            }
        }

        return true;
    }

    if(selector.type == PseudoClassSelector::Type::Not) {
        for(const auto& subSelector : selector.subSelectors) {
            for(const auto& simpleSelector : subSelector) {
                if(matchSimpleSelector(simpleSelector, element)) {
                    return false;
                }
            }
        }

        return true;
    }

    if(selector.type == PseudoClassSelector::Type::FirstChild)
        return !element->previousElement();
    if(selector.type == PseudoClassSelector::Type::LastChild)
        return !element->nextElement();
    if(selector.type == PseudoClassSelector::Type::OnlyChild)
        return !(element->previousElement() || element->nextElement());
    if(selector.type == PseudoClassSelector::Type::FirstOfType) {
        auto sibling = element->previousElement();
        while(sibling) {
            if(sibling->id() == element->id())
                return false;
            sibling = element->previousElement();
        }

        return true;
    }

    if(selector.type == PseudoClassSelector::Type::LastOfType) {
        auto sibling = element->nextElement();
        while(sibling) {
            if(sibling->id() == element->id())
                return false;
            sibling = element->nextElement();
        }

        return true;
    }

    return false;
}